

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_delay_init(ma_delay_config *pConfig,ma_allocation_callbacks *pAllocationCallbacks,
                       ma_delay *pDelay)

{
  ma_uint32 mVar1;
  ma_result mVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ma_uint32 mVar6;
  ma_uint32 mVar7;
  ma_bool32 mVar8;
  ma_result mVar9;
  float *p;
  
  mVar2 = MA_INVALID_ARGS;
  mVar9 = MA_INVALID_ARGS;
  if (pDelay != (ma_delay *)0x0) {
    *(undefined8 *)&pDelay->bufferSizeInFrames = 0;
    pDelay->pBuffer = (float *)0x0;
    (pDelay->config).wet = 0.0;
    (pDelay->config).dry = 0.0;
    *(undefined8 *)&(pDelay->config).decay = 0;
    (pDelay->config).channels = 0;
    (pDelay->config).sampleRate = 0;
    (pDelay->config).delayInFrames = 0;
    (pDelay->config).delayStart = 0;
    mVar9 = mVar2;
    if (((pConfig != (ma_delay_config *)0x0) && (0.0 <= pConfig->decay)) && (pConfig->decay <= 1.0))
    {
      mVar1 = pConfig->channels;
      mVar6 = pConfig->sampleRate;
      mVar7 = pConfig->delayInFrames;
      mVar8 = pConfig->delayStart;
      fVar3 = pConfig->wet;
      fVar4 = pConfig->dry;
      fVar5 = pConfig->decay;
      (pDelay->config).delayStart = pConfig->delayStart;
      (pDelay->config).wet = fVar3;
      (pDelay->config).dry = fVar4;
      (pDelay->config).decay = fVar5;
      (pDelay->config).channels = mVar1;
      (pDelay->config).sampleRate = mVar6;
      (pDelay->config).delayInFrames = mVar7;
      (pDelay->config).delayStart = mVar8;
      mVar1 = pConfig->delayInFrames;
      pDelay->bufferSizeInFrames = mVar1;
      pDelay->cursor = 0;
      p = (float *)ma_malloc((ulong)(mVar1 * pConfig->channels * 4),pAllocationCallbacks);
      pDelay->pBuffer = p;
      if (p == (float *)0x0) {
        mVar9 = MA_OUT_OF_MEMORY;
      }
      else {
        ma_silence_pcm_frames(p,(ulong)pDelay->bufferSizeInFrames,ma_format_f32,pConfig->channels);
        mVar9 = MA_SUCCESS;
      }
    }
  }
  return mVar9;
}

Assistant:

MA_API ma_result ma_delay_init(const ma_delay_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_delay* pDelay)
{
    if (pDelay == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pDelay);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConfig->decay < 0 || pConfig->decay > 1) {
        return MA_INVALID_ARGS;
    }

    pDelay->config             = *pConfig;
    pDelay->bufferSizeInFrames = pConfig->delayInFrames;
    pDelay->cursor             = 0;

    pDelay->pBuffer = (float*)ma_malloc((size_t)(pDelay->bufferSizeInFrames * ma_get_bytes_per_frame(ma_format_f32, pConfig->channels)), pAllocationCallbacks);
    if (pDelay->pBuffer == NULL) {
        return MA_OUT_OF_MEMORY;
    }

    ma_silence_pcm_frames(pDelay->pBuffer, pDelay->bufferSizeInFrames, ma_format_f32, pConfig->channels);

    return MA_SUCCESS;
}